

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CryptoRandomDataProvider.cc
# Opt level: O3

void __thiscall
CryptoRandomDataProvider::provideRandomData(CryptoRandomDataProvider *this,uchar *data,size_t len)

{
  shared_ptr<QPDFCryptoImpl> crypto;
  undefined8 local_28;
  undefined8 local_20;
  
  QPDFCryptoProvider::getImpl();
  (**(code **)(*local_28 + 0x10))(local_28,data,len);
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  return;
}

Assistant:

void
CryptoRandomDataProvider::provideRandomData(unsigned char* data, size_t len)
{
    auto crypto = QPDFCryptoProvider::getImpl();
    crypto->provideRandomData(data, len);
}